

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O1

void duckdb::DateSubFunction<duckdb::timestamp_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  uint *puVar1;
  byte bVar2;
  reference a;
  reference b;
  reference c;
  NotImplementedException *this;
  uint *puVar3;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  a = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  b = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  c = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,2);
  if (*a != (value_type)0x2) {
    TernaryExecutor::
    ExecuteGeneric<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::TernaryLambdaWrapperWithNulls,long(*)(duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
              (a,b,c,result,*(idx_t *)(args + 0x18),
               DateSubTernaryOperator::
               Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long>);
    return;
  }
  if ((*(byte **)(a + 0x28) != (byte *)0x0) && ((**(byte **)(a + 0x28) & 1) == 0)) {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::ConstantVector::SetNull(result,true);
    return;
  }
  puVar1 = *(uint **)(a + 0x20);
  if ((ulong)*puVar1 < 0xd) {
    puVar3 = puVar1 + 1;
  }
  else {
    puVar3 = *(uint **)(puVar1 + 2);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,puVar3,(ulong)*puVar1 + (long)puVar3);
  bVar2 = duckdb::GetDatePartSpecifier((string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (bVar2 < 0x18) {
    switch(bVar2) {
    case 0:
    case 0xe:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::YearOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case 1:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::MonthOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    default:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::DayOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case 3:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::DecadeOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case 4:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::CenturyOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case 5:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::MilleniumOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case 6:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::MicrosecondsOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case 7:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::MillisecondsOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case 8:
    case 0x16:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::SecondsOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case 9:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::MinutesOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case 10:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::HoursOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case 0xd:
    case 0x11:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::WeekOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result);
      break;
    case 0xf:
      BinaryExecutor::
      ExecuteSwitch<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::BinaryLambdaWrapperWithNulls,bool,duckdb::DateSub::BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::QuarterOperator>(duckdb::Vector&,duckdb::Vector&,duckdb::Vector&,unsigned_long)::_lambda(duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)_1_>
                (b,c,result,*(undefined8 *)(args + 0x18));
      break;
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
      goto switchD_005b0f6b_caseD_12;
    }
    return;
  }
switchD_005b0f6b_caseD_12:
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Specifier type not implemented for DATESUB","");
  duckdb::NotImplementedException::NotImplementedException(this,(string *)local_50);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void DateSubFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);
	auto &part_arg = args.data[0];
	auto &start_arg = args.data[1];
	auto &end_arg = args.data[2];

	if (part_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// Common case of constant part.
		if (ConstantVector::IsNull(part_arg)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			const auto type = GetDatePartSpecifier(ConstantVector::GetData<string_t>(part_arg)->GetString());
			DateSubBinaryExecutor<T, T, int64_t>(type, start_arg, end_arg, result, args.size());
		}
	} else {
		TernaryExecutor::ExecuteWithNulls<string_t, T, T, int64_t>(
		    part_arg, start_arg, end_arg, result, args.size(),
		    DateSubTernaryOperator::Operation<string_t, T, T, int64_t>);
	}
}